

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

int lyv_list_equal(void *val1_p,void *val2_p,int UNUSED_mod,void *UNUSED_cb_data)

{
  uint uVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *elem;
  undefined8 *puVar4;
  ly_ctx *ctx;
  int iVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long *plVar10;
  
  if ((val1_p == (void *)0x0) || (val2_p == (void *)0x0)) {
    __assert_fail("val1_p && val2_p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x17a,"int lyv_list_equal(void *, void *, int, void *)");
  }
  plVar2 = *val1_p;
  if (plVar2 == (long *)0x0) {
LAB_0011e901:
    __assert_fail("first && (first->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x17f,"int lyv_list_equal(void *, void *, int, void *)");
  }
  puVar3 = (undefined8 *)*plVar2;
  uVar1 = *(uint *)(puVar3 + 7);
  if ((uVar1 & 0x18) == 0) goto LAB_0011e901;
  elem = *val2_p;
  if ((elem == (long *)0x0) || (puVar4 = (undefined8 *)*elem, puVar4 != puVar3)) {
    __assert_fail("second && (second->schema == first->schema)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
                  ,0x180,"int lyv_list_equal(void *, void *, int, void *)");
  }
  ctx = *(ly_ctx **)puVar3[6];
  if (uVar1 == 0x10) {
    if ((ulong)*(byte *)((long)puVar3 + 0x1e) != 0) {
      uVar8 = 0;
LAB_0011e875:
      if (uVar8 != *(byte *)((long)puVar3 + 0x1e)) {
        lVar9 = *(long *)(puVar3[0x11] + uVar8 * 8);
        for (plVar6 = plVar2 + 8; plVar6 = (long *)*plVar6, plVar10 = elem + 8,
            plVar6 != (long *)0x0; plVar6 = plVar6 + 3) {
          if (*plVar6 == lVar9) {
            lVar7 = plVar6[7];
            goto LAB_0011e89f;
          }
        }
        lVar7 = 0;
LAB_0011e89f:
        do {
          plVar10 = (long *)*plVar10;
          if (plVar10 == (long *)0x0) goto LAB_0011e8b2;
          if (*plVar10 == lVar9) {
            lVar9 = plVar10[7];
            goto LAB_0011e8bb;
          }
          plVar10 = plVar10 + 3;
        } while( true );
      }
      ly_vlog(ctx,LYE_DUPLIST,LY_VLOG_LYD,elem,*puVar4);
      goto LAB_0011e8f9;
    }
LAB_0011e8c3:
    iVar5 = 0;
  }
  else {
    if (uVar1 == 8) {
      if ((((*(byte *)(puVar3 + 3) & 2) != 0) &&
          ((*(byte *)((undefined8 *)puVar3[6] + 8) & 0xc) != 0)) || (plVar2[7] != elem[7]))
      goto LAB_0011e8c3;
      ly_vlog(ctx,LYE_DUPLEAFLIST,LY_VLOG_LYD,elem,*puVar4);
    }
    else {
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/validation.c"
             ,0x1b3);
    }
LAB_0011e8f9:
    iVar5 = 1;
  }
  return iVar5;
LAB_0011e8b2:
  lVar9 = 0;
LAB_0011e8bb:
  uVar8 = uVar8 + 1;
  if (lVar7 != lVar9) goto LAB_0011e8c3;
  goto LAB_0011e875;
}

Assistant:

static int
lyv_list_equal(void *val1_p, void *val2_p, int UNUSED(mod), void *UNUSED(cb_data))
{
    struct ly_ctx *ctx;
    struct lys_node_list *slist;
    const struct lys_node *snode = NULL;
    struct lyd_node *diter, *first, *second;
    const char *val1, *val2;
    int i;

    assert(val1_p && val2_p);

    first = *((struct lyd_node **)val1_p);
    second = *((struct lyd_node **)val2_p);

    assert(first && (first->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)));
    assert(second && (second->schema == first->schema));

    ctx = first->schema->module->ctx;

    switch (first->schema->nodetype) {
    case LYS_LEAFLIST:
        if ((first->schema->flags & LYS_CONFIG_R) && first->schema->module->version >= LYS_VERSION_1_1) {
            /* same values are allowed for status data */
            return 0;
        }
        /* compare values */
        if (ly_strequal(((struct lyd_node_leaf_list *)first)->value_str,
                        ((struct lyd_node_leaf_list *)second)->value_str, 1)) {
            LOGVAL(ctx, LYE_DUPLEAFLIST, LY_VLOG_LYD, second, second->schema->name,
                   ((struct lyd_node_leaf_list *)second)->value_str);
            return 1;
        }
        return 0;
    case LYS_LIST:
        slist = (struct lys_node_list *)first->schema;

        /* compare keys */
        if (!slist->keys_size) {
            /* status lists without keys */
            return 0;
        } else {
            for (i = 0; i < slist->keys_size; i++) {
                snode = (struct lys_node *)slist->keys[i];
                val1 = val2 = NULL;
                LY_TREE_FOR(first->child, diter) {
                    if (diter->schema == snode) {
                        val1 = ((struct lyd_node_leaf_list *)diter)->value_str;
                        break;
                    }
                }
                LY_TREE_FOR(second->child, diter) {
                    if (diter->schema == snode) {
                        val2 = ((struct lyd_node_leaf_list *)diter)->value_str;
                        break;
                    }
                }
                if (!ly_strequal(val1, val2, 1)) {
                    return 0;
                }
            }
        }

        LOGVAL(ctx, LYE_DUPLIST, LY_VLOG_LYD, second, second->schema->name);
        return 1;

    default:
        LOGINT(ctx);
        return 1;
    }
}